

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O2

void __thiscall
QInputMethodEvent::QInputMethodEvent
          (QInputMethodEvent *this,QString *preeditText,
          QList<QInputMethodEvent::Attribute> *attributes)

{
  QEvent::QEvent(&this->super_QEvent,InputMethod);
  *(undefined ***)this = &PTR__QInputMethodEvent_0077cbe8;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->m_preedit).d,&preeditText->d);
  (this->m_commit).d.d = (Data *)0x0;
  (this->m_commit).d.ptr = (char16_t *)0x0;
  (this->m_commit).d.size = 0;
  QArrayDataPointer<QInputMethodEvent::Attribute>::QArrayDataPointer
            (&(this->m_attributes).d,&attributes->d);
  this->m_replacementStart = 0;
  this->m_replacementLength = 0;
  return;
}

Assistant:

QInputMethodEvent::QInputMethodEvent(const QString &preeditText, const QList<Attribute> &attributes)
    : QEvent(QEvent::InputMethod), m_preedit(preeditText), m_attributes(attributes),
      m_replacementStart(0), m_replacementLength(0)
{
}